

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::addClique
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,CliqueVar *cliquevars,
          HighsInt numcliquevars,bool equality,HighsInt origin)

{
  pointer *ppCVar1;
  double *pdVar2;
  HighsDomain *this_00;
  CliqueVar CVar3;
  CliqueVar CVar4;
  HighsMipSolverData *pHVar5;
  pointer piVar6;
  HighsMipSolverData *pHVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  iterator iVar10;
  byte bVar11;
  bool bVar12;
  HighsInt HVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  CliqueVar *pCVar17;
  _Rb_tree_node_base *p_Var18;
  CliqueVar *pCVar19;
  _Rb_tree_node_base *p_Var20;
  CliqueVar *pCVar21;
  uint uVar22;
  uint uVar23;
  uint col;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  long lVar28;
  _Rb_tree_node_base *p_Var29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  
  pHVar5 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar5->domain;
  if (numcliquevars != 0) {
    uVar30 = 0;
    pCVar21 = cliquevars;
    do {
      resolveSubstitution(this,pCVar21);
      uVar31 = (ulong)((uint)cliquevars[uVar30] & 0x7fffffff);
      dVar34 = *(double *)
                (*(long *)&(pHVar5->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar31 * 8)
      ;
      pdVar2 = (double *)
               (*(long *)&(pHVar5->domain).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar31 * 8);
      if ((dVar34 == *pdVar2) && (!NAN(dVar34) && !NAN(*pdVar2))) {
        dVar33 = (double)((uint)cliquevars[uVar30] >> 0x1f);
        dVar34 = *(double *)
                  (*(long *)&(pHVar5->domain).col_lower_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  uVar31 * 8);
        if ((dVar34 == dVar33) && (!NAN(dVar34) && !NAN(dVar33))) {
          if (uVar30 != 0) {
            uVar31 = uVar30;
            do {
              dVar34 = 1.0;
              if ((int)*cliquevars < 0) {
                dVar34 = 0.0;
              }
              uVar23 = (uint)*cliquevars & 0x7fffffff;
              dVar33 = *(double *)
                        (*(long *)&(pHVar5->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              dVar35 = *(double *)
                        (*(long *)&(pHVar5->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              HighsDomain::fixCol(this_00,uVar23,dVar34,(Reason)0xfffffffe);
              if ((pHVar5->domain).infeasible_ != false) {
                return;
              }
              if ((dVar33 != dVar35) || (NAN(dVar33) || NAN(dVar35))) {
                this->nfixings = this->nfixings + 1;
                iVar10._M_current =
                     (this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (this->infeasvertexstack).
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)&this->infeasvertexstack,iVar10,cliquevars);
                }
                else {
                  *iVar10._M_current = *cliquevars;
                  ppCVar1 = &(this->infeasvertexstack).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
              cliquevars = cliquevars + 1;
              uVar31 = uVar31 - 1;
            } while (uVar31 != 0);
          }
          if ((int)uVar30 + 1 < numcliquevars) {
            uVar30 = (numcliquevars - 1) - uVar30;
            do {
              pCVar21 = pCVar21 + 1;
              dVar34 = 1.0;
              if ((int)*pCVar21 < 0) {
                dVar34 = 0.0;
              }
              uVar23 = (uint)*pCVar21 & 0x7fffffff;
              dVar33 = *(double *)
                        (*(long *)&(pHVar5->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              dVar35 = *(double *)
                        (*(long *)&(pHVar5->domain).col_upper_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl +
                        (ulong)uVar23 * 8);
              HighsDomain::fixCol(this_00,uVar23,dVar34,(Reason)0xfffffffe);
              if ((pHVar5->domain).infeasible_ != false) {
                return;
              }
              if ((dVar33 != dVar35) || (NAN(dVar33) || NAN(dVar35))) {
                this->nfixings = this->nfixings + 1;
                iVar10._M_current =
                     (this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar10._M_current ==
                    (this->infeasvertexstack).
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
                  _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                            ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                              *)&this->infeasvertexstack,iVar10,pCVar21);
                }
                else {
                  *iVar10._M_current = *pCVar21;
                  ppCVar1 = &(this->infeasvertexstack).
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppCVar1 = *ppCVar1 + 1;
                }
              }
              uVar23 = (int)uVar30 - 1;
              uVar30 = (ulong)uVar23;
            } while (uVar23 != 0);
          }
          goto LAB_002629ba;
        }
      }
      uVar30 = uVar30 + 1;
      pCVar21 = pCVar21 + 1;
    } while ((uint)numcliquevars != uVar30);
  }
  if (numcliquevars < 0x65) {
    bVar27 = numcliquevars < 2;
    if (1 < numcliquevars) {
      uVar31 = 1;
      uVar23 = 1;
      uVar30 = 0;
      bVar11 = 0;
LAB_002621f0:
      CVar3 = cliquevars[uVar30];
      dVar34 = *(double *)
                (*(long *)&(pHVar5->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl +
                (ulong)((uint)CVar3 & 0x7fffffff) * 8);
      pdVar2 = (double *)
               (*(long *)&(pHVar5->domain).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl +
               (ulong)((uint)CVar3 & 0x7fffffff) * 8);
      if ((dVar34 != *pdVar2) || (NAN(dVar34) || NAN(*pdVar2))) {
        piVar6 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((piVar6[(int)((int)CVar3 << 1 | (uint)((int)CVar3 < 0))] == 0) &&
           (piVar6[(int)((int)CVar3 << 1 | (uint)((int)((int)CVar3 + 0x80000000U) < 0))] == 0)) {
          bVar11 = 1;
          goto LAB_0026278b;
        }
        bVar26 = true;
        uVar32 = uVar31;
        uVar22 = uVar23;
        do {
          CVar3 = cliquevars[uVar32];
          dVar34 = *(double *)
                    (*(long *)&(pHVar5->domain).col_lower_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl +
                    (ulong)((uint)CVar3 & 0x7fffffff) * 8);
          pdVar2 = (double *)
                   (*(long *)&(pHVar5->domain).col_upper_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl +
                   (ulong)((uint)CVar3 & 0x7fffffff) * 8);
          if (((dVar34 != *pdVar2) || (NAN(dVar34) || NAN(*pdVar2))) &&
             (((((uint)cliquevars[uVar30] ^ (uint)CVar3) & 0x7fffffff) == 0 ||
              (HVar13 = findCommonCliqueId(this,&this->numNeighbourhoodQueries,cliquevars[uVar30],
                                           CVar3), HVar13 == -1)))) {
            bVar12 = processNewEdge(this,this_00,cliquevars[uVar30],cliquevars[uVar32]);
            if ((pHVar5->domain).infeasible_ != false) goto LAB_00262765;
            pHVar7 = (mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            if (((long)*(pointer *)((long)&(pHVar7->nodequeue).nodes + 8) -
                 *(long *)&(pHVar7->nodequeue).nodes.
                           super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>
                           ._M_impl >> 4) * -0x71c71c71c71c71c7 -
                (((long)*(pointer *)((long)&(pHVar7->nodequeue).freeslots + 8) -
                  *(long *)&(pHVar7->nodequeue).freeslots.c.
                            super__Vector_base<long,_std::allocator<long>_> >> 3) +
                (pHVar7->nodequeue).numSuboptimal) != 0) {
              CVar3 = cliquevars[uVar30];
              lVar25 = *(long *)((long)&(pHVar7->nodequeue).colLowerNodesPtr +
                                (ulong)(~(uint)CVar3 >> 0x1f) * 8);
              lVar28 = ((ulong)(uint)CVar3 & 0x7fffffff) * 0x38;
              if (*(long *)(lVar25 + 0x30 + lVar28) != 0) {
                CVar4 = cliquevars[uVar32];
                lVar24 = ((ulong)(uint)CVar4 & 0x7fffffff) * 0x38 +
                         *(long *)((long)&(pHVar7->nodequeue).colLowerNodesPtr +
                                  (ulong)(~(uint)CVar4 >> 0x1f) * 8);
                if (*(long *)(lVar24 + 0x30) != 0) {
                  lVar25 = lVar25 + lVar28;
                  dVar34 = (double)((uint)CVar3 >> 0x1f);
                  p_Var18 = (_Rb_tree_node_base *)(lVar25 + 0x10);
                  p_Var8 = *(_Rb_tree_node_base **)(lVar25 + 0x18);
                  p_Var15 = p_Var18;
                  for (p_Var29 = p_Var8; p_Var29 != (_Rb_tree_node_base *)0x0;
                      p_Var29 = *(_Rb_tree_node_base **)((long)&p_Var29->_M_color + lVar25)) {
                    if ((*(double *)(p_Var29 + 1) < dVar34) ||
                       ((lVar25 = 0x10, p_Var16 = p_Var29, *(double *)(p_Var29 + 1) <= dVar34 &&
                        ((long)p_Var29[1]._M_parent < 0x7fffffff)))) {
                      lVar25 = 0x18;
                      p_Var16 = p_Var15;
                    }
                    p_Var15 = p_Var16;
                  }
                  for (; p_Var8 != (_Rb_tree_node_base *)0x0;
                      p_Var8 = *(_Rb_tree_node_base **)((long)&p_Var8->_M_color + lVar25)) {
                    lVar25 = 0x10;
                    p_Var29 = p_Var8;
                    if ((*(double *)(p_Var8 + 1) <= dVar34) &&
                       ((*(double *)(p_Var8 + 1) < dVar34 ||
                        ((long)p_Var8[1]._M_parent < 0x80000000)))) {
                      lVar25 = 0x18;
                      p_Var29 = p_Var18;
                    }
                    p_Var18 = p_Var29;
                  }
                  dVar34 = (double)((uint)CVar4 >> 0x1f);
                  p_Var14 = (_Rb_tree_node_base *)(lVar24 + 0x10);
                  p_Var8 = *(_Rb_tree_node_base **)(lVar24 + 0x18);
                  p_Var16 = p_Var14;
                  for (p_Var29 = p_Var8; p_Var29 != (_Rb_tree_node_base *)0x0;
                      p_Var29 = *(_Rb_tree_node_base **)((long)&p_Var29->_M_color + lVar25)) {
                    if ((*(double *)(p_Var29 + 1) < dVar34) ||
                       ((lVar25 = 0x10, p_Var20 = p_Var29, *(double *)(p_Var29 + 1) <= dVar34 &&
                        ((long)p_Var29[1]._M_parent < 0x7fffffff)))) {
                      lVar25 = 0x18;
                      p_Var20 = p_Var16;
                    }
                    p_Var16 = p_Var20;
                  }
                  for (; p_Var8 != (_Rb_tree_node_base *)0x0;
                      p_Var8 = *(_Rb_tree_node_base **)((long)&p_Var8->_M_color + lVar25)) {
                    lVar25 = 0x10;
                    p_Var29 = p_Var8;
                    if ((*(double *)(p_Var8 + 1) <= dVar34) &&
                       ((*(double *)(p_Var8 + 1) < dVar34 ||
                        ((long)p_Var8[1]._M_parent < 0x80000000)))) {
                      lVar25 = 0x18;
                      p_Var29 = p_Var14;
                    }
                    p_Var14 = p_Var29;
                  }
                  if (((p_Var15 != p_Var18) && (p_Var16 != p_Var14)) &&
                     ((p_Var9 = p_Var15[1]._M_parent, lVar25 = std::_Rb_tree_decrement(p_Var14),
                      (long)p_Var9 <= *(long *)(lVar25 + 0x28) ||
                      (p_Var9 = p_Var16[1]._M_parent, lVar25 = std::_Rb_tree_decrement(p_Var18),
                      (long)p_Var9 <= *(long *)(lVar25 + 0x28))))) {
                    while ((p_Var15 != p_Var18 && (p_Var16 != p_Var14))) {
                      p_Var9 = p_Var16[1]._M_parent;
                      if ((long)p_Var15[1]._M_parent < (long)p_Var9) {
                        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                      }
                      else if ((long)p_Var9 < (long)p_Var15[1]._M_parent) {
                        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
                      }
                      else {
                        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
                        dVar33 = HighsNodeQueue::pruneNode
                                           (&((mipsolver->mipdata_)._M_t.
                                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>.
                                             _M_head_impl)->nodequeue,(long)(int)p_Var9);
                        pHVar7 = (mipsolver->mipdata_)._M_t.
                                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
                        dVar34 = (pHVar7->pruned_treeweight).hi;
                        dVar35 = dVar33 + dVar34;
                        (pHVar7->pruned_treeweight).hi = dVar35;
                        (pHVar7->pruned_treeweight).lo =
                             (dVar34 - (dVar35 - dVar33)) + (dVar33 - (dVar35 - (dVar35 - dVar33)))
                             + (pHVar7->pruned_treeweight).lo;
                      }
                    }
                  }
                }
              }
            }
            bVar11 = 1;
            if (bVar12) {
              uVar32 = 0;
              pCVar21 = cliquevars;
              goto LAB_0026266c;
            }
          }
          uVar32 = uVar32 + 1;
          bVar26 = (int)uVar32 < numcliquevars;
          uVar22 = uVar22 + 1;
        } while (uVar32 != (uint)numcliquevars);
        goto LAB_0026276a;
      }
      goto LAB_0026278b;
    }
    bVar11 = 0;
LAB_002627a3:
    if (!bVar27) {
      return;
    }
    if (!(bool)(origin != 0x7fffffff | bVar11)) {
      return;
    }
  }
  uVar30 = (ulong)numcliquevars;
  pCVar21 = cliquevars + uVar30;
  pCVar17 = cliquevars;
  if (0 < (long)uVar30 >> 2) {
    lVar25 = *(long *)&(pHVar5->domain).col_lower_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    lVar28 = *(long *)&(pHVar5->domain).col_upper_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
    pCVar17 = cliquevars + (uVar30 & 0xfffffffffffffffc);
    lVar24 = ((long)uVar30 >> 2) + 1;
    pCVar19 = cliquevars + 2;
    do {
      dVar34 = *(double *)(lVar25 + (ulong)((uint)pCVar19[-2] & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar28 + (ulong)((uint)pCVar19[-2] & 0x7fffffff) * 8);
      if ((dVar34 == *pdVar2) && (!NAN(dVar34) && !NAN(*pdVar2))) {
        pCVar19 = pCVar19 + -2;
        goto LAB_00262943;
      }
      dVar34 = *(double *)(lVar25 + (ulong)((uint)pCVar19[-1] & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar28 + (ulong)((uint)pCVar19[-1] & 0x7fffffff) * 8);
      if ((dVar34 == *pdVar2) && (!NAN(dVar34) && !NAN(*pdVar2))) {
        pCVar19 = pCVar19 + -1;
        goto LAB_00262943;
      }
      dVar34 = *(double *)(lVar25 + (ulong)((uint)*pCVar19 & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar28 + (ulong)((uint)*pCVar19 & 0x7fffffff) * 8);
      if ((dVar34 == *pdVar2) && (!NAN(dVar34) && !NAN(*pdVar2))) goto LAB_00262943;
      dVar34 = *(double *)(lVar25 + (ulong)((uint)pCVar19[1] & 0x7fffffff) * 8);
      pdVar2 = (double *)(lVar28 + (ulong)((uint)pCVar19[1] & 0x7fffffff) * 8);
      if ((dVar34 == *pdVar2) && (!NAN(dVar34) && !NAN(*pdVar2))) {
        pCVar19 = pCVar19 + 1;
        goto LAB_00262943;
      }
      lVar24 = lVar24 + -1;
      pCVar19 = pCVar19 + 4;
    } while (1 < lVar24);
  }
  lVar25 = (long)pCVar21 - (long)pCVar17 >> 2;
  if (lVar25 != 1) {
    if (lVar25 != 2) {
      pCVar19 = pCVar21;
      if (lVar25 != 3) goto LAB_00262943;
      dVar34 = *(double *)
                (*(long *)&(pHVar5->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl +
                (ulong)((uint)*pCVar17 & 0x7fffffff) * 8);
      pdVar2 = (double *)
               (*(long *)&(pHVar5->domain).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl +
               (ulong)((uint)*pCVar17 & 0x7fffffff) * 8);
      if ((dVar34 == *pdVar2) && (pCVar19 = pCVar17, !NAN(dVar34) && !NAN(*pdVar2)))
      goto LAB_00262943;
      pCVar17 = pCVar17 + 1;
    }
    dVar34 = *(double *)
              (*(long *)&(pHVar5->domain).col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl +
              (ulong)((uint)*pCVar17 & 0x7fffffff) * 8);
    pdVar2 = (double *)
             (*(long *)&(pHVar5->domain).col_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl +
             (ulong)((uint)*pCVar17 & 0x7fffffff) * 8);
    if ((dVar34 == *pdVar2) && (pCVar19 = pCVar17, !NAN(dVar34) && !NAN(*pdVar2)))
    goto LAB_00262943;
    pCVar17 = pCVar17 + 1;
  }
  dVar34 = *(double *)
            (*(long *)&(pHVar5->domain).col_lower_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl +
            (ulong)((uint)*pCVar17 & 0x7fffffff) * 8);
  pdVar2 = (double *)
           (*(long *)&(pHVar5->domain).col_upper_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
           (ulong)((uint)*pCVar17 & 0x7fffffff) * 8);
  if ((dVar34 != *pdVar2) || (pCVar19 = pCVar17, NAN(dVar34) || NAN(*pdVar2))) {
    pCVar19 = pCVar21;
  }
LAB_00262943:
  pCVar17 = pCVar19;
  if (pCVar19 != pCVar21) {
    while (pCVar17 = pCVar17 + 1, pCVar17 != pCVar21) {
      uVar30 = (ulong)((uint)*pCVar17 & 0x7fffffff);
      dVar34 = *(double *)
                (*(long *)&(pHVar5->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar30 * 8)
      ;
      pdVar2 = (double *)
               (*(long *)&(pHVar5->domain).col_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl + uVar30 * 8);
      if ((dVar34 != *pdVar2) || (NAN(dVar34) || NAN(*pdVar2))) {
        *pCVar19 = *pCVar17;
        pCVar19 = pCVar19 + 1;
      }
    }
  }
  HVar13 = (HighsInt)((ulong)((long)pCVar19 - (long)cliquevars) >> 2);
  if (HVar13 < 2) {
    return;
  }
  doAddClique(this,cliquevars,HVar13,equality,origin);
LAB_002629ba:
  processInfeasibleVertices(this,this_00);
  return;
LAB_0026266c:
  do {
    if ((uVar30 != uVar32) && (uVar22 != uVar32)) {
      dVar34 = 1.0;
      if ((int)*pCVar21 < 0) {
        dVar34 = 0.0;
      }
      col = (uint)*pCVar21 & 0x7fffffff;
      dVar33 = *(double *)
                (*(long *)&(pHVar5->domain).col_lower_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl +
                (ulong)col * 8);
      dVar35 = *(double *)
                (*(long *)&(pHVar5->domain).col_upper_.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl +
                (ulong)col * 8);
      HighsDomain::fixCol(this_00,col,dVar34,(Reason)0xfffffffe);
      if ((pHVar5->domain).infeasible_ != false) goto LAB_00262765;
      if ((dVar33 != dVar35) || (NAN(dVar33) || NAN(dVar35))) {
        this->nfixings = this->nfixings + 1;
        iVar10._M_current =
             (this->infeasvertexstack).
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar10._M_current ==
            (this->infeasvertexstack).
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                    ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                      *)&this->infeasvertexstack,iVar10,pCVar21);
        }
        else {
          *iVar10._M_current = *pCVar21;
          ppCVar1 = &(this->infeasvertexstack).
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppCVar1 = *ppCVar1 + 1;
        }
      }
    }
    uVar32 = uVar32 + 1;
    pCVar21 = pCVar21 + 1;
  } while ((uint)numcliquevars != uVar32);
  processInfeasibleVertices(this,this_00);
LAB_00262765:
  bVar11 = 1;
LAB_0026276a:
  if (bVar26) goto LAB_002627a3;
LAB_0026278b:
  uVar30 = uVar30 + 1;
  bVar27 = (long)(int)(numcliquevars - 1U) <= (long)uVar30;
  uVar31 = uVar31 + 1;
  uVar23 = uVar23 + 1;
  if (uVar30 == numcliquevars - 1U) goto LAB_002627a3;
  goto LAB_002621f0;
}

Assistant:

void HighsCliqueTable::addClique(const HighsMipSolver& mipsolver,
                                 CliqueVar* cliquevars, HighsInt numcliquevars,
                                 bool equality, HighsInt origin) {
  HighsDomain& globaldom = mipsolver.mipdata_->domain;
  mipsolver.mipdata_->debugSolution.checkClique(cliquevars, numcliquevars);
  for (HighsInt i = 0; i != numcliquevars; ++i) {
    resolveSubstitution(cliquevars[i]);
    if (globaldom.isFixed(cliquevars[i].col)) {
      if (cliquevars[i].val == globaldom.col_lower_[cliquevars[i].col]) {
        // column is fixed to 1, every other entry can be fixed to zero
        HighsInt k;
        for (k = 0; k < i; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }
        for (k = i + 1; k < numcliquevars; ++k) {
          bool wasfixed = globaldom.isFixed(cliquevars[k].col);
          globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
          if (globaldom.infeasible()) return;
          if (!wasfixed) {
            ++nfixings;
            infeasvertexstack.push_back(cliquevars[k]);
          }
        }

        processInfeasibleVertices(globaldom);
        return;
      }
    }
  }

  if (numcliquevars <= 100) {
    bool hasNewEdge = false;

    // todo, sort new clique to allow log n lookup of membership in size by
    // binary search

    for (HighsInt i = 0; i < numcliquevars - 1; ++i) {
      if (globaldom.isFixed(cliquevars[i].col)) continue;
      if (numCliques(cliquevars[i]) == 0 &&
          numCliques(cliquevars[i].complement()) == 0) {
        hasNewEdge = true;
        continue;
      }

      for (HighsInt j = i + 1; j < numcliquevars; ++j) {
        if (globaldom.isFixed(cliquevars[j].col)) continue;

        if (haveCommonClique(cliquevars[i], cliquevars[j])) continue;
        // todo: Instead of haveCommonClique use findCommonClique. If the common
        // clique is smaller than this clique check if it is a subset of this
        // clique. If it is a subset remove the clique and iterate the process
        // until either a common clique that is not a subset of this one is
        // found, or no common clique exists anymore in which case we proceed
        // with the code below and set hasNewEdge to true

        hasNewEdge = true;

        bool iscover = processNewEdge(globaldom, cliquevars[i], cliquevars[j]);
        if (globaldom.infeasible()) return;

        if (!mipsolver.mipdata_->nodequeue.empty()) {
          const auto& v1Nodes =
              cliquevars[i].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[i].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[i].col);
          const auto& v2Nodes =
              cliquevars[j].val == 1
                  ? mipsolver.mipdata_->nodequeue.getUpNodes(cliquevars[j].col)
                  : mipsolver.mipdata_->nodequeue.getDownNodes(
                        cliquevars[j].col);

          if (!v1Nodes.empty() && !v2Nodes.empty()) {
            // general integer variables can become binary during the search
            // and the cliques might be discovered. That means we need to take
            // care here, since the set of nodes branched upwards or downwards
            // are not necessarily containing domain changes setting the
            // variables to the corresponding clique value but could be
            // redundant bound changes setting the upper bound to u >= 1 or the
            // lower bound to l <= 0.

            // itV1 will point to the first node where v1 is fixed to val and
            // endV1 to the end of the range of such nodes. Same for itV2/endV2
            // with v2.
            auto itV1 = v1Nodes.lower_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto endV1 = v1Nodes.upper_bound(
                std::make_pair(double(cliquevars[i].val), kHighsIInf));
            auto itV2 = v2Nodes.lower_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));
            auto endV2 = v2Nodes.upper_bound(
                std::make_pair(double(cliquevars[j].val), kHighsIInf));

            if (itV1 != endV1 && itV2 != endV2 &&
                (itV1->second <= std::prev(endV2)->second ||
                 itV2->second <= std::prev(endV1)->second)) {
              // node ranges overlap, check for nodes that can be pruned
              while (itV1 != endV1 && itV2 != endV2) {
                if (itV1->second < itV2->second) {
                  ++itV1;
                } else if (itV2->second < itV1->second) {
                  ++itV2;
                } else {
                  // if (!mipsolver.submip)
                  //   printf("node %d can be pruned\n", itV2->second);
                  HighsInt prunedNode = itV2->second;
                  ++itV1;
                  ++itV2;
                  mipsolver.mipdata_->pruned_treeweight +=
                      mipsolver.mipdata_->nodequeue.pruneNode(prunedNode);
                }
              }
            }
          }
        }

        if (iscover) {
          for (HighsInt k = 0; k != numcliquevars; ++k) {
            if (k == i || k == j) continue;

            bool wasfixed = globaldom.isFixed(cliquevars[k].col);
            globaldom.fixCol(cliquevars[k].col, double(1 - cliquevars[k].val));
            if (globaldom.infeasible()) return;
            if (!wasfixed) {
              ++nfixings;
              infeasvertexstack.push_back(cliquevars[k]);
            }
          }

          processInfeasibleVertices(globaldom);
          return;
        }
      }
    }
    if (!hasNewEdge && origin == kHighsIInf) return;
  }
  CliqueVar* unfixedend =
      std::remove_if(cliquevars, cliquevars + numcliquevars,
                     [&](CliqueVar v) { return globaldom.isFixed(v.col); });
  numcliquevars = unfixedend - cliquevars;
  if (numcliquevars < 2) return;

  doAddClique(cliquevars, numcliquevars, equality, origin);
  processInfeasibleVertices(globaldom);
}